

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O0

void cfg_schema_remove_section(cfg_schema *schema,cfg_schema_section *section)

{
  list_entity *plVar1;
  list_entity *plVar2;
  bool bVar3;
  ulong local_48;
  size_t i;
  cfg_schema_section *section_local;
  cfg_schema *schema_local;
  
  if ((section->_section_node).key != (void *)0x0) {
    avl_remove(&schema->sections,&section->_section_node);
    (section->_section_node).key = (void *)0x0;
    for (local_48 = 0; local_48 < section->entry_count; local_48 = local_48 + 1) {
      avl_remove(&schema->entries,&section->entries[local_48]._node);
      section->entries[local_48]._node.key = (void *)0x0;
    }
  }
  bVar3 = false;
  if ((section->_delta_node).next != (list_entity *)0x0) {
    bVar3 = (section->_delta_node).prev != (list_entity *)0x0;
  }
  if (bVar3) {
    plVar1 = (section->_delta_node).prev;
    plVar2 = (section->_delta_node).next;
    plVar1->next = plVar2;
    plVar2->prev = plVar1;
    (section->_delta_node).prev = (list_entity *)0x0;
    (section->_delta_node).next = (list_entity *)0x0;
  }
  return;
}

Assistant:

void
cfg_schema_remove_section(struct cfg_schema *schema, struct cfg_schema_section *section) {
  size_t i;

  if (section->_section_node.key) {
    avl_remove(&schema->sections, &section->_section_node);
    section->_section_node.key = NULL;

    for (i = 0; i < section->entry_count; i++) {
      avl_remove(&schema->entries, &section->entries[i]._node);
      section->entries[i]._node.key = NULL;
    }
  }
  if (list_is_node_added(&section->_delta_node)) {
    list_remove(&section->_delta_node);
  }
}